

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O0

asn_enc_rval_t *
INTEGER_encode_der(asn_TYPE_descriptor_t *td,void *sptr,int tag_mode,ber_tlv_tag_t tag,
                  asn_app_consume_bytes_f *cb,void *app_key)

{
  uint in_ECX;
  long *in_RDX;
  undefined8 *in_RSI;
  char *pcVar1;
  asn_enc_rval_t *in_RDI;
  long in_R9;
  uint8_t *end;
  uint8_t *nb;
  int shift;
  uint8_t *end1;
  uint8_t *buf;
  INTEGER_t *st;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffd0;
  
  pcVar1 = "Estimating";
  if (in_R9 != 0) {
    pcVar1 = "Encoding";
  }
  ASN_DEBUG("%s %s as INTEGER (tm=%d)",pcVar1,*in_RSI,(ulong)in_ECX);
  if (*in_RDX != 0) {
    in_stack_ffffffffffffffd0 = (char *)*in_RDX;
    pcVar1 = in_stack_ffffffffffffffd0 + (long)(int)in_RDX[1] + -1;
    for (; in_stack_ffffffffffffffd0 < pcVar1;
        in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + 1) {
      if (*in_stack_ffffffffffffffd0 == '\0') {
        if ((in_stack_ffffffffffffffd0[1] & 0x80U) != 0) break;
      }
      else if ((*in_stack_ffffffffffffffd0 != -1) || ((in_stack_ffffffffffffffd0[1] & 0x80U) == 0))
      break;
    }
    in_stack_ffffffffffffffc4 = (int)in_stack_ffffffffffffffd0 - (int)*in_RDX;
    if (in_stack_ffffffffffffffc4 != 0) {
      in_stack_ffffffffffffffb8 = (char *)*in_RDX;
      *(int *)(in_RDX + 1) = (int)in_RDX[1] - in_stack_ffffffffffffffc4;
      in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb8 + (int)in_RDX[1];
      for (; in_stack_ffffffffffffffb8 < in_stack_ffffffffffffffb0;
          in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
        *in_stack_ffffffffffffffb8 = *in_stack_ffffffffffffffd0;
        in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + 1;
      }
    }
  }
  der_encode_primitive
            ((asn_TYPE_descriptor_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
             (ber_tlv_tag_t)in_stack_ffffffffffffffb0,(asn_app_consume_bytes_f *)in_RDI,
             in_stack_ffffffffffffffd0);
  return in_RDI;
}

Assistant:

asn_enc_rval_t
INTEGER_encode_der(asn_TYPE_descriptor_t *td, void *sptr,
	int tag_mode, ber_tlv_tag_t tag,
	asn_app_consume_bytes_f *cb, void *app_key) {
	INTEGER_t *st = (INTEGER_t *)sptr;

	ASN_DEBUG("%s %s as INTEGER (tm=%d)",
		cb?"Encoding":"Estimating", td->name, tag_mode);

	/*
	 * Canonicalize integer in the buffer.
	 * (Remove too long sign extension, remove some first 0x00 bytes)
	 */
	if(st->buf) {
		uint8_t *buf = st->buf;
		uint8_t *end1 = buf + st->size - 1;
		int shift;

		/* Compute the number of superfluous leading bytes */
		for(; buf < end1; buf++) {
			/*
			 * If the contents octets of an integer value encoding
			 * consist of more than one octet, then the bits of the
			 * first octet and bit 8 of the second octet:
			 * a) shall not all be ones; and
			 * b) shall not all be zero.
			 */
			switch(*buf) {
			case 0x00: if((buf[1] & 0x80) == 0)
					continue;
				break;
			case 0xff: if((buf[1] & 0x80))
					continue;
				break;
			}
			break;
		}

		/* Remove leading superfluous bytes from the integer */
		shift = buf - st->buf;
		if(shift) {
			uint8_t *nb = st->buf;
			uint8_t *end;

			st->size -= shift;	/* New size, minus bad bytes */
			end = nb + st->size;

			for(; nb < end; nb++, buf++)
				*nb = *buf;
		}

	} /* if(1) */

	return der_encode_primitive(td, sptr, tag_mode, tag, cb, app_key);
}